

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossPlatformReporters.cpp
# Opt level: O0

void __thiscall
ApprovalTests::CrossPlatform::VisualStudioCodeReporter::VisualStudioCodeReporter
          (VisualStudioCodeReporter *this)

{
  DiffInfo *in_RDI;
  DiffInfo *in_stack_ffffffffffffffd8;
  GenericDiffReporter *in_stack_ffffffffffffffe0;
  
  DiffPrograms::CrossPlatform::VS_CODE();
  GenericDiffReporter::GenericDiffReporter(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  DiffInfo::~DiffInfo(in_RDI);
  *(undefined ***)&in_RDI->program = &PTR__VisualStudioCodeReporter_00281b68;
  return;
}

Assistant:

VisualStudioCodeReporter::VisualStudioCodeReporter()
            : GenericDiffReporter(DiffPrograms::CrossPlatform::VS_CODE())
        {
        }